

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvectorst.hpp
# Opt level: O1

void __thiscall
soplex::
SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *base)

{
  undefined8 *puVar1;
  uint *puVar2;
  undefined8 uVar3;
  Item *pIVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar19;
  undefined1 auVar20 [16];
  bool bVar21;
  int iVar22;
  pointer pnVar23;
  cpp_dec_float<50U,_int,_void> *pcVar24;
  byte bVar25;
  long lVar26;
  cpp_dec_float<50U,_int,_void> *pcVar27;
  cpp_dec_float<50U,_int,_void> *pcVar28;
  long lVar29;
  Real a;
  cpp_dec_float<50U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  cpp_dec_float<50U,_int,_void> local_388;
  cpp_dec_float<50U,_int,_void> local_348;
  long local_310;
  SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_308;
  uint local_2fc;
  cpp_dec_float<50U,_int,_void> local_2f8;
  cpp_dec_float<50U,_int,_void> local_2b8;
  cpp_dec_float<50U,_int,_void> local_278;
  cpp_dec_float<50U,_int,_void> local_238;
  cpp_dec_float<50U,_int,_void> local_1f8;
  cpp_dec_float<50U,_int,_void> local_1b8;
  long local_178;
  undefined8 uStack_170;
  cpp_dec_float<50U,_int,_void> local_168;
  long local_128;
  undefined8 uStack_120;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_110;
  undefined1 local_108 [16];
  uint local_f8 [3];
  undefined3 uStack_eb;
  uint local_e8 [3];
  bool local_dc;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  cpp_dec_float<50U,_int,_void> local_98;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_308 = this;
  local_110 = base;
  if (this->state == DVEC) {
    iVar22 = (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    lVar29 = (long)iVar22;
    if (iVar22 != (int)((ulong)((long)(this->vec).val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->vec).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249)
    goto LAB_003498e9;
    local_348.fpclass = cpp_dec_float_finite;
    local_348.prec_elem = 10;
    local_348.data._M_elems[0] = 0;
    local_348.data._M_elems[1] = 0;
    local_348.data._M_elems[2] = 0;
    local_348.data._M_elems[3] = 0;
    local_348.data._M_elems[4] = 0;
    local_348.data._M_elems[5] = 0;
    local_348.data._M_elems._24_5_ = 0;
    local_348.data._M_elems[7]._1_3_ = 0;
    local_348.data._M_elems._32_5_ = 0;
    local_348.data._M_elems[9]._1_3_ = 0;
    local_348.exp = 0;
    local_348.neg = false;
    local_1b8.fpclass = cpp_dec_float_finite;
    local_1b8.prec_elem = 10;
    local_1b8.data._M_elems[0] = 0;
    local_1b8.data._M_elems[1] = 0;
    local_1b8.data._M_elems[2] = 0;
    local_1b8.data._M_elems[3] = 0;
    local_1b8.data._M_elems[4] = 0;
    local_1b8.data._M_elems[5] = 0;
    local_1b8.data._M_elems._24_5_ = 0;
    local_1b8.data._M_elems[7]._1_3_ = 0;
    local_1b8.data._M_elems._32_5_ = 0;
    local_1b8.data._M_elems[9]._1_3_ = 0;
    local_1b8.exp = 0;
    local_1b8.neg = false;
    local_2b8.fpclass = cpp_dec_float_finite;
    local_2b8.prec_elem = 10;
    local_2b8.data._M_elems[0] = 0;
    local_2b8.data._M_elems[1] = 0;
    local_2b8.data._M_elems[2] = 0;
    local_2b8.data._M_elems[3] = 0;
    local_2b8.data._M_elems[4] = 0;
    local_2b8.data._M_elems[5] = 0;
    local_2b8.data._M_elems._24_5_ = 0;
    local_2b8.data._M_elems[7]._1_3_ = 0;
    local_2b8.data._M_elems._32_5_ = 0;
    local_2b8.data._M_elems[9]._1_3_ = 0;
    local_2b8.exp = 0;
    local_2b8.neg = false;
    if (iVar22 != 0) {
      lVar26 = lVar29 * 0x38;
      do {
        pSVar19 = local_308;
        pnVar23 = (this->vec).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_38 = *(undefined8 *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x20);
        puVar1 = (undefined8 *)((long)&pnVar23[-1].m_backend.data + lVar26);
        local_58 = *puVar1;
        uStack_50 = puVar1[1];
        puVar1 = (undefined8 *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x10);
        local_48 = *puVar1;
        uStack_40 = puVar1[1];
        local_388.exp = *(int *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x28);
        local_388.neg = *(bool *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x2c);
        local_388._48_8_ = *(undefined8 *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x30);
        local_388.data._M_elems[8] = (uint)local_38;
        local_388.data._M_elems[9] = (uint)((ulong)local_38 >> 0x20);
        local_388.data._M_elems[4] = (uint)local_48;
        local_388.data._M_elems[5] = (uint)((ulong)local_48 >> 0x20);
        local_388.data._M_elems[6] = (uint)uStack_40;
        local_388.data._M_elems[7] = (uint)((ulong)uStack_40 >> 0x20);
        local_388.data._M_elems[0] = (uint)local_58;
        local_388.data._M_elems[1] = (uint)((ulong)local_58 >> 0x20);
        local_388.data._M_elems[2] = (uint)uStack_50;
        local_388.data._M_elems[3] = (uint)((ulong)uStack_50 >> 0x20);
        if ((local_388.neg == true) &&
           (local_388.fpclass != cpp_dec_float_finite || local_388.data._M_elems[0] != 0)) {
          local_388.neg = false;
        }
        lVar29 = lVar29 + -1;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  ((cpp_dec_float<50U,_int,_void> *)
                   ((long)&(local_308->
                           super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).rowWeight.data.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar26),
                   &local_388);
        this = pSVar19;
        lVar26 = lVar26 + -0x38;
      } while (lVar29 != 0);
    }
    lVar29 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (lVar29 != 0) {
      do {
        pIVar4 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        iVar22 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[lVar29 + -1].idx;
        local_310 = lVar29;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_2b8,0);
        local_1b8.data._M_elems[0] = local_2b8.data._M_elems[0];
        local_1b8.data._M_elems[1] = local_2b8.data._M_elems[1];
        local_1b8.data._M_elems[2] = local_2b8.data._M_elems[2];
        local_1b8.data._M_elems[3] = local_2b8.data._M_elems[3];
        local_1b8.data._M_elems[4] = local_2b8.data._M_elems[4];
        local_1b8.data._M_elems[5] = local_2b8.data._M_elems[5];
        local_1b8.data._M_elems._24_5_ = local_2b8.data._M_elems._24_5_;
        local_1b8.data._M_elems[7]._1_3_ = local_2b8.data._M_elems[7]._1_3_;
        local_1b8.data._M_elems._32_5_ = local_2b8.data._M_elems._32_5_;
        local_1b8.data._M_elems[9]._1_3_ = local_2b8.data._M_elems[9]._1_3_;
        local_1b8.exp = local_2b8.exp;
        local_1b8.neg = local_2b8.neg;
        local_1b8.fpclass = local_2b8.fpclass;
        local_1b8.prec_elem = local_2b8.prec_elem;
        lVar29 = (long)pIVar4[iVar22].data.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
        if (lVar29 != 0) {
          pIVar4 = pIVar4 + iVar22;
          lVar26 = lVar29 * 0x3c;
          do {
            pNVar5 = (pIVar4->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            uVar3 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar26 + -0x1c);
            local_348.data._M_elems._32_5_ = SUB85(uVar3,0);
            local_348.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            puVar2 = (uint *)((long)&pNVar5[-1].val.m_backend.data + lVar26);
            local_348.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_348.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)&(pNVar5->val).m_backend.data + lVar26 + -0x2c);
            local_348.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar3 = *(undefined8 *)(puVar2 + 2);
            local_348.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_348.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_348.exp = *(int *)((long)&(pNVar5->val).m_backend.data + lVar26 + -0x14);
            local_348.neg = *(bool *)((long)&(pNVar5->val).m_backend.data + lVar26 + -0x10);
            local_348._48_8_ = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar26 + -0xc);
            pnVar23 = (local_308->vec).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      *(int *)((long)&(((pIVar4->data).
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       .m_elem)->val).m_backend.data + lVar26 + -4);
            local_388.fpclass = cpp_dec_float_finite;
            local_388.prec_elem = 10;
            local_388.data._M_elems[0] = 0;
            local_388.data._M_elems[1] = 0;
            local_388.data._M_elems[2] = 0;
            local_388.data._M_elems[3] = 0;
            local_388.data._M_elems[4] = 0;
            local_388.data._M_elems[5] = 0;
            local_388.data._M_elems[6] = 0;
            local_388.data._M_elems[7] = 0;
            local_388.data._M_elems[8] = 0;
            local_388.data._M_elems[9] = 0;
            local_388.exp = 0;
            local_388.neg = false;
            if (&local_388 != &pnVar23->m_backend) {
              uVar3 = *(undefined8 *)((long)&(pnVar23->m_backend).data + 0x20);
              local_388.data._M_elems[8] = (uint)uVar3;
              local_388.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
              uVar3 = *(undefined8 *)&(pnVar23->m_backend).data;
              uVar6 = *(undefined8 *)((long)&(pnVar23->m_backend).data + 8);
              uVar7 = *(undefined8 *)((long)&(pnVar23->m_backend).data + 0x10);
              uVar8 = *(undefined8 *)((long)&(pnVar23->m_backend).data + 0x18);
              local_388.data._M_elems[4] = (uint)uVar7;
              local_388.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
              local_388.data._M_elems[6] = (uint)uVar8;
              local_388.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
              local_388.data._M_elems[0] = (uint)uVar3;
              local_388.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
              local_388.data._M_elems[2] = (uint)uVar6;
              local_388.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
              local_388.exp = (pnVar23->m_backend).exp;
              local_388.neg = (pnVar23->m_backend).neg;
              local_388.fpclass = (pnVar23->m_backend).fpclass;
              local_388.prec_elem = (pnVar23->m_backend).prec_elem;
            }
            lVar29 = lVar29 + -1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_388,&local_348);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_1b8,&local_388);
            local_388.data._M_elems[8] = local_348.data._M_elems[8];
            local_388.data._M_elems[9] =
                 (uint)(CONCAT35(local_348.data._M_elems[9]._1_3_,local_348.data._M_elems._32_5_) >>
                       0x20);
            local_388.data._M_elems[4] = local_348.data._M_elems[4];
            local_388.data._M_elems[5] = local_348.data._M_elems[5];
            local_388.data._M_elems[6] = local_348.data._M_elems[6];
            local_388.data._M_elems[7] =
                 (uint)(CONCAT35(local_348.data._M_elems[7]._1_3_,local_348.data._M_elems._24_5_) >>
                       0x20);
            local_388.data._M_elems[0] = local_348.data._M_elems[0];
            local_388.data._M_elems[1] = local_348.data._M_elems[1];
            local_388.data._M_elems[2] = local_348.data._M_elems[2];
            local_388.data._M_elems[3] = local_348.data._M_elems[3];
            local_388.exp = local_348.exp;
            local_388.neg = local_348.neg;
            local_388.fpclass = local_348.fpclass;
            local_388.prec_elem = local_348.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_388,&local_348);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_2b8,&local_388);
            lVar26 = lVar26 + -0x3c;
          } while (lVar29 != 0);
        }
        base = local_110;
        lVar29 = local_310 + -1;
        if (local_2b8.fpclass != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_388,0,(type *)0x0);
          iVar22 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_2b8,&local_388);
          if (0 < iVar22) {
            local_278.fpclass = cpp_dec_float_finite;
            local_278.prec_elem = 10;
            local_278.data._M_elems[0] = 0;
            local_278.data._M_elems[1] = 0;
            local_278.data._M_elems[2] = 0;
            local_278.data._M_elems[3] = 0;
            local_278.data._M_elems[4] = 0;
            local_278.data._M_elems[5] = 0;
            local_278.data._M_elems[6] = 0;
            local_278.data._M_elems[7] = 0;
            local_278.data._M_elems[8] = 0;
            local_278.data._M_elems[9] = 0;
            local_278.exp = 0;
            local_278.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_278,&local_1b8,&local_2b8);
            local_310 = lVar29 * 0x38;
            pcVar28 = &(base->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar29].m_backend;
            local_d8._0_4_ = cpp_dec_float_finite;
            local_d8._4_4_ = 10;
            local_108 = (undefined1  [16])0x0;
            local_f8[0] = 0;
            local_f8[1] = 0;
            stack0xffffffffffffff10 = 0;
            uStack_eb = 0;
            local_e8[0] = 0;
            local_e8[1] = 0;
            local_e8[2] = 0;
            local_dc = false;
            if ((cpp_dec_float<50U,_int,_void> *)local_108 == pcVar28) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_108,&local_278);
              if (local_108._0_4_ != 0 || (fpclass_type)local_d8 != cpp_dec_float_finite) {
                local_dc = (bool)(local_dc ^ 1);
              }
            }
            else {
              local_e8[1] = local_278.data._M_elems[9];
              local_e8[0] = local_278.data._M_elems[8];
              local_108._4_4_ = local_278.data._M_elems[1];
              local_108._0_4_ = local_278.data._M_elems[0];
              local_108._12_4_ = local_278.data._M_elems[3];
              local_108._8_4_ = local_278.data._M_elems[2];
              local_f8[1] = local_278.data._M_elems[5];
              local_f8[0] = local_278.data._M_elems[4];
              stack0xffffffffffffff10 =
                   (undefined5)CONCAT44(local_278.data._M_elems[7],local_278.data._M_elems[6]);
              uStack_eb = (undefined3)(local_278.data._M_elems[7] >> 8);
              local_e8[2] = local_278.exp;
              local_dc = local_278.neg;
              local_d8._0_4_ = local_278.fpclass;
              local_d8._4_4_ = local_278.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)local_108,pcVar28);
            }
            local_388.data._M_elems[8] = (uint)local_e8._0_8_;
            local_388.data._M_elems[9] = SUB84(local_e8._0_8_,4);
            local_388.data._M_elems[4] = (uint)local_f8._0_8_;
            local_388.data._M_elems[5] = SUB84(local_f8._0_8_,4);
            local_388.data._M_elems[6] = (uint)stack0xffffffffffffff10;
            local_388.data._M_elems[7] = (uint)(CONCAT35(uStack_eb,stack0xffffffffffffff10) >> 0x20)
            ;
            local_388.data._M_elems[0] = local_108._0_4_;
            local_388.data._M_elems[1] = local_108._4_4_;
            local_388.data._M_elems[2] = local_108._8_4_;
            local_388.data._M_elems[3] = local_108._12_4_;
            local_388.exp = local_e8[2];
            local_388.neg = local_dc;
            local_388.fpclass = (fpclass_type)local_d8;
            local_388.prec_elem = local_d8._4_4_;
            if ((local_dc == true) &&
               ((fpclass_type)local_d8 != cpp_dec_float_finite || local_388.data._M_elems[0] != 0))
            {
              local_388.neg = false;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      ((cpp_dec_float<50U,_int,_void> *)
                       ((long)&(((local_308->
                                 super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).colWeight.data.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                       local_310),&local_388);
          }
        }
      } while (lVar29 != 0);
    }
  }
  else {
    if ((this->state != PVEC) ||
       ((base->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum !=
        (int)((ulong)((long)(this->vec).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->vec).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249)) {
LAB_003498e9:
      SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setupWeights(&this->
                      super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ,base);
      return;
    }
    a = Tolerances::epsilon((base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._tolerances.
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    local_1b8.fpclass = cpp_dec_float_finite;
    local_1b8.prec_elem = 10;
    local_1b8.data._M_elems._0_16_ = ZEXT816(0);
    local_1b8.data._M_elems[4] = 0;
    local_1b8.data._M_elems[5] = 0;
    local_1b8.data._M_elems._24_5_ = 0;
    local_1b8.data._M_elems[7]._1_3_ = 0;
    local_1b8.data._M_elems._32_5_ = 0;
    local_1b8.data._M_elems[9]._1_3_ = 0;
    local_1b8.exp = 0;
    local_1b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_1b8,a);
    local_2b8.fpclass = cpp_dec_float_finite;
    local_2b8.prec_elem = 10;
    local_2b8.data._M_elems._0_16_ = ZEXT816(0);
    local_2b8.data._M_elems[4] = 0;
    local_2b8.data._M_elems[5] = 0;
    local_2b8.data._M_elems._24_5_ = 0;
    local_2b8.data._M_elems[7]._1_3_ = 0;
    local_2b8.data._M_elems._32_5_ = 0;
    local_2b8.data._M_elems[9]._1_3_ = 0;
    local_2b8.exp = 0;
    local_2b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_388,10000,(type *)0x0);
    local_2b8.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
    local_2b8.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
    local_2b8.data._M_elems[4] = local_1b8.data._M_elems[4];
    local_2b8.data._M_elems[5] = local_1b8.data._M_elems[5];
    local_2b8.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
    local_2b8.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
    local_2b8.data._M_elems[0] = local_1b8.data._M_elems[0];
    local_2b8.data._M_elems[1] = local_1b8.data._M_elems[1];
    local_2b8.data._M_elems[2] = local_1b8.data._M_elems[2];
    local_2b8.data._M_elems[3] = local_1b8.data._M_elems[3];
    local_2b8.exp = local_1b8.exp;
    local_2b8.neg = local_1b8.neg;
    local_2b8.fpclass = local_1b8.fpclass;
    local_2b8.prec_elem = local_1b8.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&local_2b8,&local_388);
    local_278.fpclass = cpp_dec_float_finite;
    local_278.prec_elem = 10;
    local_278.data._M_elems[0] = 0;
    local_278.data._M_elems[1] = 0;
    local_278.data._M_elems[2] = 0;
    local_278.data._M_elems[3] = 0;
    local_278.data._M_elems[4] = 0;
    local_278.data._M_elems[5] = 0;
    local_278.data._M_elems[6] = 0;
    local_278.data._M_elems[7] = 0;
    local_278.data._M_elems[8] = 0;
    local_278.data._M_elems[9] = 0;
    local_278.exp = 0;
    local_278.neg = false;
    local_238.fpclass = cpp_dec_float_finite;
    local_238.prec_elem = 10;
    local_238.data._M_elems[0] = 0;
    local_238.data._M_elems[1] = 0;
    local_238.data._M_elems[2] = 0;
    local_238.data._M_elems[3] = 0;
    local_238.data._M_elems[4] = 0;
    local_238.data._M_elems[5] = 0;
    local_238.data._M_elems[6] = 0;
    local_238.data._M_elems[7] = 0;
    local_238.data._M_elems[8] = 0;
    local_238.data._M_elems[9] = 0;
    local_238.exp = 0;
    local_238.neg = false;
    lVar29 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (lVar29 != 0) {
      lVar26 = lVar29 * 0x38;
      do {
        pnVar23 = (this->vec).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar28 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar23[-1].m_backend.data + lVar26);
        pcVar24 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar26);
        local_388.fpclass = cpp_dec_float_finite;
        local_388.prec_elem = 10;
        local_388.data._M_elems[0] = 0;
        local_388.data._M_elems[1] = 0;
        local_388.data._M_elems[2] = 0;
        local_388.data._M_elems[3] = 0;
        local_388.data._M_elems[4] = 0;
        local_388.data._M_elems[5] = 0;
        local_388.data._M_elems[6] = 0;
        local_388.data._M_elems[7] = 0;
        local_388.data._M_elems[8] = 0;
        local_388.data._M_elems[9] = 0;
        local_388.exp = 0;
        local_388.neg = false;
        if (pcVar24 == &local_388) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_388,pcVar28);
          if (local_388.data._M_elems[0] != 0 || local_388.fpclass != cpp_dec_float_finite) {
            local_388.neg = (bool)(local_388.neg ^ 1);
          }
        }
        else {
          if (pcVar28 != &local_388) {
            uVar3 = *(undefined8 *)((pcVar28->data)._M_elems + 8);
            local_388.data._M_elems[8] = (uint)uVar3;
            local_388.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
            uVar3 = *(undefined8 *)(pcVar28->data)._M_elems;
            uVar6 = *(undefined8 *)((pcVar28->data)._M_elems + 2);
            uVar7 = *(undefined8 *)((pcVar28->data)._M_elems + 4);
            uVar8 = *(undefined8 *)((pcVar28->data)._M_elems + 6);
            local_388.data._M_elems[4] = (uint)uVar7;
            local_388.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
            local_388.data._M_elems[6] = (uint)uVar8;
            local_388.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
            local_388.data._M_elems[0] = (uint)uVar3;
            local_388.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
            local_388.data._M_elems[2] = (uint)uVar6;
            local_388.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
            local_388.exp = *(int *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x28);
            local_388.neg = *(bool *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x2c);
            local_388._48_8_ = *(long *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x30);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_388,pcVar24);
        }
        local_278.data._M_elems[8] = local_388.data._M_elems[8];
        local_278.data._M_elems[9] = local_388.data._M_elems[9];
        local_278.data._M_elems[4] = local_388.data._M_elems[4];
        local_278.data._M_elems[5] = local_388.data._M_elems[5];
        local_278.data._M_elems[6] = local_388.data._M_elems[6];
        local_278.data._M_elems[7] = local_388.data._M_elems[7];
        local_278.data._M_elems[0] = local_388.data._M_elems[0];
        local_278.data._M_elems[1] = local_388.data._M_elems[1];
        local_278.data._M_elems[2] = local_388.data._M_elems[2];
        local_278.data._M_elems[3] = local_388.data._M_elems[3];
        local_278.exp = local_388.exp;
        local_278.neg = local_388.neg;
        local_278.fpclass = local_388.fpclass;
        local_278.prec_elem = local_388.prec_elem;
        pnVar23 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar28 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar23[-1].m_backend.data + lVar26);
        pcVar24 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)&(this->vec).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar26);
        local_388.fpclass = cpp_dec_float_finite;
        local_388.prec_elem = 10;
        local_388.data._M_elems[0] = 0;
        local_388.data._M_elems[1] = 0;
        local_388.data._M_elems[2] = 0;
        local_388.data._M_elems[3] = 0;
        local_388.data._M_elems[4] = 0;
        local_388.data._M_elems[5] = 0;
        local_388.data._M_elems[6] = 0;
        local_388.data._M_elems[7] = 0;
        local_388.data._M_elems[8] = 0;
        local_388.data._M_elems[9] = 0;
        local_388.exp = 0;
        local_388.neg = false;
        if (pcVar24 == &local_388) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_388,pcVar28);
          if (local_388.data._M_elems[0] != 0 || local_388.fpclass != cpp_dec_float_finite) {
            local_388.neg = (bool)(local_388.neg ^ 1);
          }
        }
        else {
          if (pcVar28 != &local_388) {
            uVar3 = *(undefined8 *)((pcVar28->data)._M_elems + 8);
            local_388.data._M_elems[8] = (uint)uVar3;
            local_388.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
            uVar3 = *(undefined8 *)(pcVar28->data)._M_elems;
            uVar6 = *(undefined8 *)((pcVar28->data)._M_elems + 2);
            uVar7 = *(undefined8 *)((pcVar28->data)._M_elems + 4);
            uVar8 = *(undefined8 *)((pcVar28->data)._M_elems + 6);
            local_388.data._M_elems[4] = (uint)uVar7;
            local_388.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
            local_388.data._M_elems[6] = (uint)uVar8;
            local_388.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
            local_388.data._M_elems[0] = (uint)uVar3;
            local_388.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
            local_388.data._M_elems[2] = (uint)uVar6;
            local_388.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
            local_388.exp = *(int *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x28);
            local_388.neg = *(bool *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x2c);
            local_388._48_8_ = *(long *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x30);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_388,pcVar24);
        }
        local_238.data._M_elems[8] = local_388.data._M_elems[8];
        local_238.data._M_elems[9] = local_388.data._M_elems[9];
        local_238.data._M_elems[4] = local_388.data._M_elems[4];
        local_238.data._M_elems[5] = local_388.data._M_elems[5];
        local_238.data._M_elems[6] = local_388.data._M_elems[6];
        local_238.data._M_elems[7] = local_388.data._M_elems[7];
        local_238.data._M_elems[0] = local_388.data._M_elems[0];
        local_238.data._M_elems[1] = local_388.data._M_elems[1];
        local_238.data._M_elems[2] = local_388.data._M_elems[2];
        local_238.data._M_elems[3] = local_388.data._M_elems[3];
        local_238.exp = local_388.exp;
        local_238.neg = local_388.neg;
        local_238.fpclass = local_388.fpclass;
        local_238.prec_elem = local_388.prec_elem;
        if ((local_388.fpclass == 2 || local_278.fpclass == cpp_dec_float_NaN) ||
           (iVar22 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_278,&local_238), uVar9 = local_278.data._M_elems[0],
           -1 < iVar22)) {
          uVar9 = local_238.data._M_elems[0];
          local_178 = CONCAT44(local_178._4_4_,local_238.exp);
          local_2f8.data._M_elems[1] = local_238.data._M_elems[2];
          local_2f8.data._M_elems[0] = local_238.data._M_elems[1];
          local_2f8.data._M_elems[3] = local_238.data._M_elems[4];
          local_2f8.data._M_elems[2] = local_238.data._M_elems[3];
          local_2f8.data._M_elems[5] = local_238.data._M_elems[6];
          local_2f8.data._M_elems[4] = local_238.data._M_elems[5];
          local_2f8.data._M_elems[7] = local_238.data._M_elems[8];
          local_2f8.data._M_elems[6] = local_238.data._M_elems[7];
          local_2f8.data._M_elems[8] = local_238.data._M_elems[9];
          bVar25 = (local_238.fpclass != 0 || local_238.data._M_elems[0] != 0) ^ local_238.neg;
          pcVar24 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .object.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar26);
          local_348.fpclass = cpp_dec_float_finite;
          local_348.prec_elem = 10;
          local_348.data._M_elems._0_16_ = ZEXT816(0);
          local_348.data._M_elems[4] = 0;
          local_348.data._M_elems[5] = 0;
          local_348.data._M_elems._24_5_ = 0;
          local_348.data._M_elems[7]._1_3_ = 0;
          local_348.data._M_elems._32_5_ = 0;
          local_348.data._M_elems[9]._1_3_ = 0;
          local_348.exp = 0;
          local_348.neg = false;
          pcVar28 = &local_2b8;
          if (pcVar24 != &local_348) {
            local_348.data._M_elems._32_5_ = local_2b8.data._M_elems._32_5_;
            local_348.data._M_elems[9]._1_3_ = local_2b8.data._M_elems[9]._1_3_;
            local_348.data._M_elems[4] = local_2b8.data._M_elems[4];
            local_348.data._M_elems[5] = local_2b8.data._M_elems[5];
            local_348.data._M_elems._24_5_ = local_2b8.data._M_elems._24_5_;
            local_348.data._M_elems[7]._1_3_ = local_2b8.data._M_elems[7]._1_3_;
            local_348.data._M_elems[0] = local_2b8.data._M_elems[0];
            local_348.data._M_elems[1] = local_2b8.data._M_elems[1];
            local_348.data._M_elems[2] = local_2b8.data._M_elems[2];
            local_348.data._M_elems[3] = local_2b8.data._M_elems[3];
            local_348.exp = local_2b8.exp;
            local_348.neg = local_2b8.neg;
            local_348.fpclass = local_2b8.fpclass;
            local_348.prec_elem = local_2b8.prec_elem;
            pcVar28 = pcVar24;
          }
          local_128._0_4_ = local_238.fpclass;
          local_128._4_4_ = local_238.prec_elem;
          uStack_120 = 0;
          local_310 = lVar29;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_348,pcVar28);
          local_388.data._M_elems[0] = uVar9;
          local_388.data._M_elems[9] = local_2f8.data._M_elems[8];
          local_388.data._M_elems[1] = local_2f8.data._M_elems[0];
          local_388.data._M_elems[2] = local_2f8.data._M_elems[1];
          local_388.data._M_elems[3] = local_2f8.data._M_elems[2];
          local_388.data._M_elems[4] = local_2f8.data._M_elems[3];
          local_388.data._M_elems[5] = local_2f8.data._M_elems[4];
          local_388.data._M_elems[6] = local_2f8.data._M_elems[5];
          local_388.data._M_elems[7] = local_2f8.data._M_elems[6];
          local_388.data._M_elems[8] = local_2f8.data._M_elems[7];
          local_388.exp = (int)local_178;
          local_388.fpclass = (int)local_128;
          local_388.prec_elem = local_128._4_4_;
          local_388.neg = (bool)bVar25;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_388,&local_348);
          pnVar23 = (local_308->
                    super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).colWeight.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)((long)&pnVar23[-1].m_backend.data + lVar26);
          *puVar1 = CONCAT44(local_388.data._M_elems[1],local_388.data._M_elems[0]);
          puVar1[1] = CONCAT44(local_388.data._M_elems[3],local_388.data._M_elems[2]);
          puVar1 = (undefined8 *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x10);
          *puVar1 = CONCAT44(local_388.data._M_elems[5],local_388.data._M_elems[4]);
          puVar1[1] = CONCAT44(local_388.data._M_elems[7],local_388.data._M_elems[6]);
          *(ulong *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x20) =
               CONCAT44(local_388.data._M_elems[9],local_388.data._M_elems[8]);
          *(int *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x28) = local_388.exp;
          *(bool *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x2c) = local_388.neg;
          *(undefined8 *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x30) = local_388._48_8_;
          bVar21 = true;
          lVar29 = local_310;
        }
        else {
          local_310 = CONCAT44(local_310._4_4_,local_278.exp);
          local_2f8.data._M_elems[1] = local_278.data._M_elems[2];
          local_2f8.data._M_elems[0] = local_278.data._M_elems[1];
          local_2f8.data._M_elems[3] = local_278.data._M_elems[4];
          local_2f8.data._M_elems[2] = local_278.data._M_elems[3];
          local_2f8.data._M_elems[5] = local_278.data._M_elems[6];
          local_2f8.data._M_elems[4] = local_278.data._M_elems[5];
          local_2f8.data._M_elems[7] = local_278.data._M_elems[8];
          local_2f8.data._M_elems[6] = local_278.data._M_elems[7];
          local_2f8.data._M_elems[8] = local_278.data._M_elems[9];
          bVar25 = (local_278.fpclass != 0 || local_278.data._M_elems[0] != 0) ^ local_278.neg;
          pcVar24 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .object.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar26);
          local_348.fpclass = cpp_dec_float_finite;
          local_348.prec_elem = 10;
          local_348.data._M_elems._0_16_ = ZEXT816(0);
          local_348.data._M_elems[4] = 0;
          local_348.data._M_elems[5] = 0;
          local_348.data._M_elems._24_5_ = 0;
          local_348.data._M_elems[7]._1_3_ = 0;
          local_348.data._M_elems._32_5_ = 0;
          local_348.data._M_elems[9]._1_3_ = 0;
          local_348.exp = 0;
          local_348.neg = false;
          pcVar28 = &local_2b8;
          if (pcVar24 != &local_348) {
            local_348.data._M_elems._32_5_ = local_2b8.data._M_elems._32_5_;
            local_348.data._M_elems[9]._1_3_ = local_2b8.data._M_elems[9]._1_3_;
            local_348.data._M_elems[4] = local_2b8.data._M_elems[4];
            local_348.data._M_elems[5] = local_2b8.data._M_elems[5];
            local_348.data._M_elems._24_5_ = local_2b8.data._M_elems._24_5_;
            local_348.data._M_elems[7]._1_3_ = local_2b8.data._M_elems[7]._1_3_;
            local_348.data._M_elems[0] = local_2b8.data._M_elems[0];
            local_348.data._M_elems[1] = local_2b8.data._M_elems[1];
            local_348.data._M_elems[2] = local_2b8.data._M_elems[2];
            local_348.data._M_elems[3] = local_2b8.data._M_elems[3];
            local_348.exp = local_2b8.exp;
            local_348.neg = local_2b8.neg;
            local_348.fpclass = local_2b8.fpclass;
            local_348.prec_elem = local_2b8.prec_elem;
            pcVar28 = pcVar24;
          }
          local_178._0_4_ = local_278.fpclass;
          local_178._4_4_ = local_278.prec_elem;
          uStack_170 = 0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_348,pcVar28);
          local_388.data._M_elems[0] = uVar9;
          local_388.data._M_elems[9] = local_2f8.data._M_elems[8];
          local_388.data._M_elems[1] = local_2f8.data._M_elems[0];
          local_388.data._M_elems[2] = local_2f8.data._M_elems[1];
          local_388.data._M_elems[3] = local_2f8.data._M_elems[2];
          local_388.data._M_elems[4] = local_2f8.data._M_elems[3];
          local_388.data._M_elems[5] = local_2f8.data._M_elems[4];
          local_388.data._M_elems[6] = local_2f8.data._M_elems[5];
          local_388.data._M_elems[7] = local_2f8.data._M_elems[6];
          local_388.data._M_elems[8] = local_2f8.data._M_elems[7];
          local_388.exp = (int)local_310;
          local_388.fpclass = (int)local_178;
          local_388.prec_elem = local_178._4_4_;
          local_388.neg = (bool)bVar25;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_388,&local_348);
          pnVar23 = (local_308->
                    super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).colWeight.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)((long)&pnVar23[-1].m_backend.data + lVar26);
          *puVar1 = CONCAT44(local_388.data._M_elems[1],local_388.data._M_elems[0]);
          puVar1[1] = CONCAT44(local_388.data._M_elems[3],local_388.data._M_elems[2]);
          puVar1 = (undefined8 *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x10);
          *puVar1 = CONCAT44(local_388.data._M_elems[5],local_388.data._M_elems[4]);
          puVar1[1] = CONCAT44(local_388.data._M_elems[7],local_388.data._M_elems[6]);
          *(ulong *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x20) =
               CONCAT44(local_388.data._M_elems[9],local_388.data._M_elems[8]);
          *(int *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x28) = local_388.exp;
          *(bool *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x2c) = local_388.neg;
          *(undefined8 *)((long)&pnVar23[-1].m_backend.data + lVar26 + 0x30) = local_388._48_8_;
          bVar21 = false;
        }
        (local_308->
        super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).colUp.data[lVar29 + -1] = bVar21;
        lVar29 = lVar29 + -1;
        this = local_308;
        lVar26 = lVar26 + -0x38;
      } while (lVar29 != 0);
    }
    local_310 = (long)(base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum;
    if (local_310 != 0) {
      do {
        pIVar4 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem +
                 (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[local_310 + -1].idx;
        local_388.fpclass = cpp_dec_float_finite;
        local_388.prec_elem = 10;
        local_388.data._M_elems[0] = 0;
        local_388.data._M_elems[1] = 0;
        local_388.data._M_elems[2] = 0;
        local_388.data._M_elems[3] = 0;
        local_388.data._M_elems[4] = 0;
        local_388.data._M_elems[5] = 0;
        local_388.data._M_elems[6] = 0;
        local_388.data._M_elems[7] = 0;
        local_388.data._M_elems[8] = 0;
        local_388.data._M_elems[9] = 0;
        local_388.exp = 0;
        local_388.neg = false;
        lVar29 = (long)(pIVar4->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
        if (0 < lVar29) {
          lVar26 = lVar29 + 1;
          lVar29 = lVar29 * 0x3c;
          do {
            pNVar5 = (pIVar4->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pcVar27 = (cpp_dec_float<50U,_int,_void> *)
                      ((long)&pNVar5[-1].val.m_backend.data + lVar29);
            pcVar24 = &(local_308->vec).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&pNVar5[-1].val + 1) + lVar29)].m_backend;
            local_348.fpclass = cpp_dec_float_finite;
            local_348.prec_elem = 10;
            local_348.data._M_elems[0] = 0;
            local_348.data._M_elems[1] = 0;
            local_348.data._M_elems[2] = 0;
            local_348.data._M_elems[3] = 0;
            local_348.data._M_elems[4] = 0;
            local_348.data._M_elems[5] = 0;
            local_348.data._M_elems._24_5_ = 0;
            local_348.data._M_elems[7]._1_3_ = 0;
            local_348.data._M_elems._32_5_ = 0;
            local_348.data._M_elems[9]._1_3_ = 0;
            local_348.exp = 0;
            local_348.neg = false;
            pcVar28 = pcVar24;
            if ((pcVar27 != &local_348) && (pcVar28 = pcVar27, &local_348 != pcVar24)) {
              uVar3 = *(undefined8 *)((pcVar24->data)._M_elems + 8);
              local_348.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_348.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_348.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar24->data)._M_elems;
              local_348.data._M_elems._16_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar24->data)._M_elems + 6);
              local_348.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_348.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_348.exp = pcVar24->exp;
              local_348.neg = pcVar24->neg;
              local_348.fpclass = pcVar24->fpclass;
              local_348.prec_elem = pcVar24->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_348,pcVar28);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_388,&local_348);
            lVar26 = lVar26 + -1;
            lVar29 = lVar29 + -0x3c;
          } while (1 < lVar26);
        }
        uVar3 = local_388._48_8_;
        bVar21 = local_388.neg;
        iVar22 = local_388.exp;
        uVar18 = local_388.data._M_elems[9];
        uVar17 = local_388.data._M_elems[8];
        uVar16 = local_388.data._M_elems[7];
        uVar15 = local_388.data._M_elems[6];
        uVar14 = local_388.data._M_elems[5];
        uVar13 = local_388.data._M_elems[4];
        uVar12 = local_388.data._M_elems[3];
        uVar11 = local_388.data._M_elems[2];
        uVar10 = local_388.data._M_elems[1];
        uVar9 = local_388.data._M_elems[0];
        lVar29 = local_310 + -1;
        local_238.data._M_elems[8] = local_388.data._M_elems[8];
        local_238.data._M_elems[9] = local_388.data._M_elems[9];
        local_238.data._M_elems[4] = local_388.data._M_elems[4];
        local_238.data._M_elems[5] = local_388.data._M_elems[5];
        local_238.data._M_elems[6] = local_388.data._M_elems[6];
        local_238.data._M_elems[7] = local_388.data._M_elems[7];
        local_238.data._M_elems[0] = local_388.data._M_elems[0];
        local_238.data._M_elems[1] = local_388.data._M_elems[1];
        local_238.data._M_elems[2] = local_388.data._M_elems[2];
        local_238.data._M_elems[3] = local_388.data._M_elems[3];
        local_238.exp = local_388.exp;
        local_238.neg = local_388.neg;
        local_238.fpclass = local_388.fpclass;
        local_238.prec_elem = local_388.prec_elem;
        pcVar28 = &(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar29].m_backend;
        local_388.fpclass = cpp_dec_float_finite;
        local_388.prec_elem = 10;
        local_388.data._M_elems[0] = 0;
        local_388.data._M_elems[1] = 0;
        local_388.data._M_elems[2] = 0;
        local_388.data._M_elems[3] = 0;
        local_388.data._M_elems[4] = 0;
        local_388.data._M_elems[5] = 0;
        local_388.data._M_elems[6] = 0;
        local_388.data._M_elems[7] = 0;
        local_388.data._M_elems[8] = 0;
        local_388.data._M_elems[9] = 0;
        local_388.exp = 0;
        local_388.neg = false;
        local_310 = lVar29;
        if (&local_388 == pcVar28) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_388,&local_238);
          if (local_388.data._M_elems[0] != 0 || local_388.fpclass != cpp_dec_float_finite) {
            local_388.neg = (bool)(local_388.neg ^ 1);
          }
        }
        else {
          local_388.data._M_elems[0] = uVar9;
          local_388.data._M_elems[1] = uVar10;
          local_388.data._M_elems[2] = uVar11;
          local_388.data._M_elems[3] = uVar12;
          local_388.data._M_elems[4] = uVar13;
          local_388.data._M_elems[5] = uVar14;
          local_388.data._M_elems[6] = uVar15;
          local_388.data._M_elems[7] = uVar16;
          local_388.data._M_elems[8] = uVar17;
          local_388.data._M_elems[9] = uVar18;
          local_388.exp = iVar22;
          local_388.neg = bVar21;
          local_388._48_8_ = uVar3;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_388,pcVar28);
        }
        local_278.data._M_elems[8] = local_388.data._M_elems[8];
        local_278.data._M_elems[9] = local_388.data._M_elems[9];
        local_278.data._M_elems[4] = local_388.data._M_elems[4];
        local_278.data._M_elems[5] = local_388.data._M_elems[5];
        local_278.data._M_elems[6] = local_388.data._M_elems[6];
        local_278.data._M_elems[7] = local_388.data._M_elems[7];
        local_278.data._M_elems[0] = local_388.data._M_elems[0];
        local_278.data._M_elems[1] = local_388.data._M_elems[1];
        local_278.data._M_elems[2] = local_388.data._M_elems[2];
        local_278.data._M_elems[3] = local_388.data._M_elems[3];
        local_278.exp = local_388.exp;
        local_278.neg = local_388.neg;
        local_278.fpclass = local_388.fpclass;
        local_278.prec_elem = local_388.prec_elem;
        pnVar23 = (base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar29;
        local_388.fpclass = cpp_dec_float_finite;
        local_388.prec_elem = 10;
        local_388.data._M_elems[0] = 0;
        local_388.data._M_elems[1] = 0;
        local_388.data._M_elems[2] = 0;
        local_388.data._M_elems[3] = 0;
        local_388.data._M_elems[4] = 0;
        local_388.data._M_elems[5] = 0;
        local_388.data._M_elems[6] = 0;
        local_388.data._M_elems[7] = 0;
        local_388.data._M_elems[8] = 0;
        local_388.data._M_elems[9] = 0;
        local_388.exp = 0;
        local_388.neg = false;
        if (&local_388 != &pnVar23->m_backend) {
          uVar3 = *(undefined8 *)((long)&(pnVar23->m_backend).data + 0x20);
          local_388.data._M_elems[8] = (uint)uVar3;
          local_388.data._M_elems[9] = (uint)((ulong)uVar3 >> 0x20);
          uVar3 = *(undefined8 *)&(pnVar23->m_backend).data;
          uVar6 = *(undefined8 *)((long)&(pnVar23->m_backend).data + 8);
          uVar7 = *(undefined8 *)((long)&(pnVar23->m_backend).data + 0x10);
          uVar8 = *(undefined8 *)((long)&(pnVar23->m_backend).data + 0x18);
          local_388.data._M_elems[4] = (uint)uVar7;
          local_388.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
          local_388.data._M_elems[6] = (uint)uVar8;
          local_388.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
          local_388.data._M_elems[0] = (uint)uVar3;
          local_388.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
          local_388.data._M_elems[2] = (uint)uVar6;
          local_388.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
          local_388.exp = (pnVar23->m_backend).exp;
          local_388.neg = (pnVar23->m_backend).neg;
          local_388.fpclass = (pnVar23->m_backend).fpclass;
          local_388.prec_elem = (pnVar23->m_backend).prec_elem;
        }
        local_178 = lVar29 * 0x38;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_388,&local_238);
        local_238.data._M_elems[0] = local_388.data._M_elems[0];
        local_238.data._M_elems[1] = local_388.data._M_elems[1];
        local_238.data._M_elems[2] = local_388.data._M_elems[2];
        local_238.data._M_elems[3] = local_388.data._M_elems[3];
        local_238.data._M_elems[4] = local_388.data._M_elems[4];
        local_238.data._M_elems[5] = local_388.data._M_elems[5];
        local_238.data._M_elems[6] = local_388.data._M_elems[6];
        local_238.data._M_elems[7] = local_388.data._M_elems[7];
        local_238.data._M_elems[8] = local_388.data._M_elems[8];
        local_238.data._M_elems[9] = local_388.data._M_elems[9];
        local_238.exp = local_388.exp;
        local_238.neg = local_388.neg;
        local_238.fpclass = local_388.fpclass;
        local_238.prec_elem = local_388.prec_elem;
        if ((local_388.fpclass == 2 || local_278.fpclass == cpp_dec_float_NaN) ||
           (iVar22 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_278,&local_238), uVar3 = local_278._48_8_, -1 < iVar22)) {
          uVar3 = local_238._48_8_;
          local_2fc = local_238.data._M_elems[0];
          local_128 = CONCAT44(local_128._4_4_,local_238.exp);
          local_c8 = CONCAT44(local_238.data._M_elems[2],local_238.data._M_elems[1]);
          uStack_c0 = CONCAT44(local_238.data._M_elems[4],local_238.data._M_elems[3]);
          local_b8 = CONCAT44(local_238.data._M_elems[6],local_238.data._M_elems[5]);
          uStack_b0 = CONCAT44(local_238.data._M_elems[8],local_238.data._M_elems[7]);
          local_a8 = local_238.data._M_elems[9];
          local_168.fpclass = cpp_dec_float_finite;
          local_168.prec_elem = 10;
          local_168.data._M_elems[0] = 0;
          local_168.data._M_elems[1] = 0;
          local_168.data._M_elems[2] = 0;
          local_168.data._M_elems[3] = 0;
          local_168.data._M_elems[4] = 0;
          local_168.data._M_elems[5] = 0;
          local_168.data._M_elems._24_5_ = 0;
          local_168.data._M_elems[7]._1_3_ = 0;
          local_168.data._M_elems._32_5_ = 0;
          local_168.data._M_elems[9]._1_3_ = 0;
          local_168.exp = 0;
          local_168.neg = false;
          bVar25 = (local_238.data._M_elems[0] != 0 || local_238.fpclass != 0) ^ local_238.neg;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_388,
                     (long)(pIVar4->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused,(type *)0x0);
          auVar20 = (undefined1  [16])local_1b8.data._M_elems._0_16_;
          local_168.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
          local_168.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
          local_168.data._M_elems[4] = local_1b8.data._M_elems[4];
          local_168.data._M_elems[5] = local_1b8.data._M_elems[5];
          local_168.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
          local_168.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
          local_168.data._M_elems[0] = local_1b8.data._M_elems[0];
          local_168.data._M_elems[1] = local_1b8.data._M_elems[1];
          local_168.data._M_elems[2] = local_1b8.data._M_elems[2];
          local_168.data._M_elems[3] = local_1b8.data._M_elems[3];
          local_168.exp = local_1b8.exp;
          local_168.neg = local_1b8.neg;
          local_168.fpclass = local_1b8.fpclass;
          local_168.prec_elem = local_1b8.prec_elem;
          local_1b8.data._M_elems._0_16_ = auVar20;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_168,&local_388);
          base = local_110;
          uVar6 = local_238._48_8_;
          local_1f8.data._M_elems[0] = local_2fc;
          local_1f8.data._M_elems[9] = local_a8;
          local_1f8.data._M_elems[5] = (uint)local_b8;
          local_1f8.data._M_elems[6] = (uint)((ulong)local_b8 >> 0x20);
          local_1f8.data._M_elems[7] = (uint)uStack_b0;
          local_1f8.data._M_elems[8] = (uint)((ulong)uStack_b0 >> 0x20);
          local_1f8.data._M_elems[1] = (uint)local_c8;
          local_1f8.data._M_elems[2] = (uint)((ulong)local_c8 >> 0x20);
          local_1f8.data._M_elems[3] = (uint)uStack_c0;
          local_1f8.data._M_elems[4] = (uint)((ulong)uStack_c0 >> 0x20);
          local_1f8.exp = (int)local_128;
          local_238.fpclass = (fpclass_type)uVar3;
          local_238.prec_elem = SUB84(uVar3,4);
          local_1f8.fpclass = local_238.fpclass;
          local_1f8.prec_elem = local_238.prec_elem;
          local_238._48_8_ = uVar6;
          local_1f8.neg = (bool)bVar25;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_1f8,&local_168);
          local_388.fpclass = cpp_dec_float_finite;
          local_388.prec_elem = 10;
          local_388.data._M_elems[0] = 0;
          local_388.data._M_elems[1] = 0;
          local_388.data._M_elems[2] = 0;
          local_388.data._M_elems[3] = 0;
          local_388.data._M_elems[4] = 0;
          local_388.data._M_elems[5] = 0;
          local_388.data._M_elems[6] = 0;
          local_388.data._M_elems[7] = 0;
          local_388.data._M_elems[8] = 0;
          local_388.data._M_elems[9] = 0;
          local_388.exp = 0;
          local_388.neg = false;
          lVar29 = (long)(pIVar4->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
          if (0 < lVar29) {
            lVar26 = lVar29 + 1;
            lVar29 = lVar29 * 0x3c;
            do {
              pNVar5 = (pIVar4->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              pcVar27 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)&pNVar5[-1].val.m_backend.data + lVar29);
              pcVar24 = &(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)(&pNVar5[-1].val + 1) + lVar29)].m_backend;
              local_348.fpclass = cpp_dec_float_finite;
              local_348.prec_elem = 10;
              local_348.data._M_elems[0] = 0;
              local_348.data._M_elems[1] = 0;
              local_348.data._M_elems[2] = 0;
              local_348.data._M_elems[3] = 0;
              local_348.data._M_elems[4] = 0;
              local_348.data._M_elems[5] = 0;
              local_348.data._M_elems._24_5_ = 0;
              local_348.data._M_elems[7]._1_3_ = 0;
              local_348.data._M_elems._32_5_ = 0;
              local_348.data._M_elems[9]._1_3_ = 0;
              local_348.exp = 0;
              local_348.neg = false;
              pcVar28 = pcVar24;
              if ((pcVar27 != &local_348) && (pcVar28 = pcVar27, &local_348 != pcVar24)) {
                uVar3 = *(undefined8 *)((pcVar24->data)._M_elems + 8);
                local_348.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_348.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_348.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar24->data)._M_elems;
                local_348.data._M_elems._16_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar24->data)._M_elems + 6);
                local_348.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_348.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_348.exp = pcVar24->exp;
                local_348.neg = pcVar24->neg;
                local_348.fpclass = pcVar24->fpclass;
                local_348.prec_elem = pcVar24->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_348,pcVar28);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_388,&local_348);
              lVar26 = lVar26 + -1;
              lVar29 = lVar29 + -0x3c;
            } while (1 < lVar26);
          }
          auVar20 = (undefined1  [16])local_2b8.data._M_elems._0_16_;
          local_348.data._M_elems._32_5_ =
               SUB85(CONCAT44(local_388.data._M_elems[9],local_388.data._M_elems[8]),0);
          local_348.data._M_elems[9]._1_3_ = (undefined3)(local_388.data._M_elems[9] >> 8);
          local_348.data._M_elems[1] = local_388.data._M_elems[1];
          local_348.data._M_elems[0] = local_388.data._M_elems[0];
          local_348.data._M_elems[3] = local_388.data._M_elems[3];
          local_348.data._M_elems[2] = local_388.data._M_elems[2];
          local_348.data._M_elems[5] = local_388.data._M_elems[5];
          local_348.data._M_elems[4] = local_388.data._M_elems[4];
          local_348.data._M_elems._24_5_ =
               SUB85(CONCAT44(local_388.data._M_elems[7],local_388.data._M_elems[6]),0);
          local_348.data._M_elems[7]._1_3_ = (undefined3)(local_388.data._M_elems[7] >> 8);
          local_348.exp = local_388.exp;
          local_348.neg = local_388.neg;
          local_348.fpclass = local_388.fpclass;
          local_348.prec_elem = local_388.prec_elem;
          local_98.data._M_elems[9]._1_3_ = local_2b8.data._M_elems[9]._1_3_;
          local_98.data._M_elems._32_5_ = local_2b8.data._M_elems._32_5_;
          local_98.data._M_elems[7]._1_3_ = local_2b8.data._M_elems[7]._1_3_;
          local_98.data._M_elems._24_5_ = local_2b8.data._M_elems._24_5_;
          local_98.data._M_elems[4] = local_2b8.data._M_elems[4];
          local_98.data._M_elems[5] = local_2b8.data._M_elems[5];
          local_98.data._M_elems[0] = local_2b8.data._M_elems[0];
          local_98.data._M_elems[1] = local_2b8.data._M_elems[1];
          local_98.data._M_elems[2] = local_2b8.data._M_elems[2];
          local_98.data._M_elems[3] = local_2b8.data._M_elems[3];
          local_98.exp = local_2b8.exp;
          local_98.neg = local_2b8.neg;
          local_98.fpclass = local_2b8.fpclass;
          local_98.prec_elem = local_2b8.prec_elem;
          local_2b8.data._M_elems._0_16_ = auVar20;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_98,&local_348);
          local_2f8.data._M_elems[9] = local_1f8.data._M_elems[9];
          local_2f8.data._M_elems[8] = local_1f8.data._M_elems[8];
          local_2f8.data._M_elems[1] = local_1f8.data._M_elems[1];
          local_2f8.data._M_elems[0] = local_1f8.data._M_elems[0];
          local_2f8.data._M_elems[3] = local_1f8.data._M_elems[3];
          local_2f8.data._M_elems[2] = local_1f8.data._M_elems[2];
          local_2f8.data._M_elems[5] = local_1f8.data._M_elems[5];
          local_2f8.data._M_elems[4] = local_1f8.data._M_elems[4];
          local_2f8.data._M_elems[7] = local_1f8.data._M_elems[7];
          local_2f8.data._M_elems[6] = local_1f8.data._M_elems[6];
          local_2f8.exp = local_1f8.exp;
          local_2f8.neg = local_1f8.neg;
          local_2f8.fpclass = local_1f8.fpclass;
          local_2f8.prec_elem = local_1f8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_2f8,&local_98);
          pnVar23 = (local_308->
                    super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).rowWeight.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = (uint *)((long)&(pnVar23->m_backend).data + local_178);
          *(undefined8 *)puVar2 = local_2f8.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = local_2f8.data._M_elems._8_8_;
          puVar2 = (uint *)((long)&(pnVar23->m_backend).data + local_178 + 0x10);
          *(undefined8 *)puVar2 = local_2f8.data._M_elems._16_8_;
          *(undefined8 *)(puVar2 + 2) = local_2f8.data._M_elems._24_8_;
          *(undefined8 *)((long)&(pnVar23->m_backend).data + local_178 + 0x20) =
               local_2f8.data._M_elems._32_8_;
          *(int *)((long)&(pnVar23->m_backend).data + local_178 + 0x28) = local_2f8.exp;
          *(bool *)((long)&(pnVar23->m_backend).data + local_178 + 0x2c) = local_2f8.neg;
          *(undefined8 *)((long)&(pnVar23->m_backend).data + local_178 + 0x30) = local_2f8._48_8_;
          bVar21 = true;
        }
        else {
          local_2fc = local_278.data._M_elems[0];
          local_128 = CONCAT44(local_128._4_4_,local_278.exp);
          local_c8 = CONCAT44(local_278.data._M_elems[2],local_278.data._M_elems[1]);
          uStack_c0 = CONCAT44(local_278.data._M_elems[4],local_278.data._M_elems[3]);
          local_b8 = CONCAT44(local_278.data._M_elems[6],local_278.data._M_elems[5]);
          uStack_b0 = CONCAT44(local_278.data._M_elems[8],local_278.data._M_elems[7]);
          local_a8 = local_278.data._M_elems[9];
          local_168.fpclass = cpp_dec_float_finite;
          local_168.prec_elem = 10;
          local_168.data._M_elems[0] = 0;
          local_168.data._M_elems[1] = 0;
          local_168.data._M_elems[2] = 0;
          local_168.data._M_elems[3] = 0;
          local_168.data._M_elems[4] = 0;
          local_168.data._M_elems[5] = 0;
          local_168.data._M_elems._24_5_ = 0;
          local_168.data._M_elems[7]._1_3_ = 0;
          local_168.data._M_elems._32_5_ = 0;
          local_168.data._M_elems[9]._1_3_ = 0;
          local_168.exp = 0;
          local_168.neg = false;
          bVar25 = (local_278.data._M_elems[0] != 0 || local_278.fpclass != 0) ^ local_278.neg;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_388,
                     (long)(pIVar4->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused,(type *)0x0);
          auVar20 = (undefined1  [16])local_1b8.data._M_elems._0_16_;
          local_168.data._M_elems._32_5_ = local_1b8.data._M_elems._32_5_;
          local_168.data._M_elems[9]._1_3_ = local_1b8.data._M_elems[9]._1_3_;
          local_168.data._M_elems[4] = local_1b8.data._M_elems[4];
          local_168.data._M_elems[5] = local_1b8.data._M_elems[5];
          local_168.data._M_elems._24_5_ = local_1b8.data._M_elems._24_5_;
          local_168.data._M_elems[7]._1_3_ = local_1b8.data._M_elems[7]._1_3_;
          local_168.data._M_elems[0] = local_1b8.data._M_elems[0];
          local_168.data._M_elems[1] = local_1b8.data._M_elems[1];
          local_168.data._M_elems[2] = local_1b8.data._M_elems[2];
          local_168.data._M_elems[3] = local_1b8.data._M_elems[3];
          local_168.exp = local_1b8.exp;
          local_168.neg = local_1b8.neg;
          local_168.fpclass = local_1b8.fpclass;
          local_168.prec_elem = local_1b8.prec_elem;
          local_1b8.data._M_elems._0_16_ = auVar20;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_168,&local_388);
          uVar6 = local_278._48_8_;
          local_1f8.data._M_elems[0] = local_2fc;
          local_1f8.data._M_elems[9] = local_a8;
          local_1f8.data._M_elems[5] = (uint)local_b8;
          local_1f8.data._M_elems[6] = (uint)((ulong)local_b8 >> 0x20);
          local_1f8.data._M_elems[7] = (uint)uStack_b0;
          local_1f8.data._M_elems[8] = (uint)((ulong)uStack_b0 >> 0x20);
          local_1f8.data._M_elems[1] = (uint)local_c8;
          local_1f8.data._M_elems[2] = (uint)((ulong)local_c8 >> 0x20);
          local_1f8.data._M_elems[3] = (uint)uStack_c0;
          local_1f8.data._M_elems[4] = (uint)((ulong)uStack_c0 >> 0x20);
          local_1f8.exp = (int)local_128;
          local_278.fpclass = (fpclass_type)uVar3;
          local_278.prec_elem = SUB84(uVar3,4);
          local_1f8.fpclass = local_278.fpclass;
          local_1f8.prec_elem = local_278.prec_elem;
          local_278._48_8_ = uVar6;
          local_1f8.neg = (bool)bVar25;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_1f8,&local_168);
          local_388.fpclass = cpp_dec_float_finite;
          local_388.prec_elem = 10;
          local_388.data._M_elems[0] = 0;
          local_388.data._M_elems[1] = 0;
          local_388.data._M_elems[2] = 0;
          local_388.data._M_elems[3] = 0;
          local_388.data._M_elems[4] = 0;
          local_388.data._M_elems[5] = 0;
          local_388.data._M_elems[6] = 0;
          local_388.data._M_elems[7] = 0;
          local_388.data._M_elems[8] = 0;
          local_388.data._M_elems[9] = 0;
          local_388.exp = 0;
          local_388.neg = false;
          lVar29 = (long)(pIVar4->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
          if (0 < lVar29) {
            lVar26 = lVar29 + 1;
            lVar29 = lVar29 * 0x3c;
            do {
              pNVar5 = (pIVar4->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              pcVar27 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)&pNVar5[-1].val.m_backend.data + lVar29);
              pcVar24 = &(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)(&pNVar5[-1].val + 1) + lVar29)].m_backend;
              local_348.fpclass = cpp_dec_float_finite;
              local_348.prec_elem = 10;
              local_348.data._M_elems[0] = 0;
              local_348.data._M_elems[1] = 0;
              local_348.data._M_elems[2] = 0;
              local_348.data._M_elems[3] = 0;
              local_348.data._M_elems[4] = 0;
              local_348.data._M_elems[5] = 0;
              local_348.data._M_elems._24_5_ = 0;
              local_348.data._M_elems[7]._1_3_ = 0;
              local_348.data._M_elems._32_5_ = 0;
              local_348.data._M_elems[9]._1_3_ = 0;
              local_348.exp = 0;
              local_348.neg = false;
              pcVar28 = pcVar24;
              if ((pcVar27 != &local_348) && (pcVar28 = pcVar27, &local_348 != pcVar24)) {
                uVar3 = *(undefined8 *)((pcVar24->data)._M_elems + 8);
                local_348.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_348.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_348.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar24->data)._M_elems;
                local_348.data._M_elems._16_8_ = *(undefined8 *)((pcVar24->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar24->data)._M_elems + 6);
                local_348.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_348.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_348.exp = pcVar24->exp;
                local_348.neg = pcVar24->neg;
                local_348.fpclass = pcVar24->fpclass;
                local_348.prec_elem = pcVar24->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_348,pcVar28);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_388,&local_348);
              lVar26 = lVar26 + -1;
              lVar29 = lVar29 + -0x3c;
            } while (1 < lVar26);
          }
          auVar20 = (undefined1  [16])local_2b8.data._M_elems._0_16_;
          local_348.data._M_elems._32_5_ =
               SUB85(CONCAT44(local_388.data._M_elems[9],local_388.data._M_elems[8]),0);
          local_348.data._M_elems[9]._1_3_ = (undefined3)(local_388.data._M_elems[9] >> 8);
          local_348.data._M_elems[1] = local_388.data._M_elems[1];
          local_348.data._M_elems[0] = local_388.data._M_elems[0];
          local_348.data._M_elems[3] = local_388.data._M_elems[3];
          local_348.data._M_elems[2] = local_388.data._M_elems[2];
          local_348.data._M_elems[5] = local_388.data._M_elems[5];
          local_348.data._M_elems[4] = local_388.data._M_elems[4];
          local_348.data._M_elems._24_5_ =
               SUB85(CONCAT44(local_388.data._M_elems[7],local_388.data._M_elems[6]),0);
          local_348.data._M_elems[7]._1_3_ = (undefined3)(local_388.data._M_elems[7] >> 8);
          local_348.exp = local_388.exp;
          local_348.neg = local_388.neg;
          local_348.fpclass = local_388.fpclass;
          local_348.prec_elem = local_388.prec_elem;
          bVar21 = false;
          local_98.data._M_elems[9]._1_3_ = local_2b8.data._M_elems[9]._1_3_;
          local_98.data._M_elems._32_5_ = local_2b8.data._M_elems._32_5_;
          local_98.data._M_elems[7]._1_3_ = local_2b8.data._M_elems[7]._1_3_;
          local_98.data._M_elems._24_5_ = local_2b8.data._M_elems._24_5_;
          local_98.data._M_elems[4] = local_2b8.data._M_elems[4];
          local_98.data._M_elems[5] = local_2b8.data._M_elems[5];
          local_98.data._M_elems[0] = local_2b8.data._M_elems[0];
          local_98.data._M_elems[1] = local_2b8.data._M_elems[1];
          local_98.data._M_elems[2] = local_2b8.data._M_elems[2];
          local_98.data._M_elems[3] = local_2b8.data._M_elems[3];
          local_98.exp = local_2b8.exp;
          local_98.neg = local_2b8.neg;
          local_98.fpclass = local_2b8.fpclass;
          local_98.prec_elem = local_2b8.prec_elem;
          local_2b8.data._M_elems._0_16_ = auVar20;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_98,&local_348);
          local_2f8.data._M_elems[9] = local_1f8.data._M_elems[9];
          local_2f8.data._M_elems[8] = local_1f8.data._M_elems[8];
          local_2f8.data._M_elems[1] = local_1f8.data._M_elems[1];
          local_2f8.data._M_elems[0] = local_1f8.data._M_elems[0];
          local_2f8.data._M_elems[3] = local_1f8.data._M_elems[3];
          local_2f8.data._M_elems[2] = local_1f8.data._M_elems[2];
          local_2f8.data._M_elems[5] = local_1f8.data._M_elems[5];
          local_2f8.data._M_elems[4] = local_1f8.data._M_elems[4];
          local_2f8.data._M_elems[7] = local_1f8.data._M_elems[7];
          local_2f8.data._M_elems[6] = local_1f8.data._M_elems[6];
          local_2f8.exp = local_1f8.exp;
          local_2f8.neg = local_1f8.neg;
          local_2f8.fpclass = local_1f8.fpclass;
          local_2f8.prec_elem = local_1f8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_2f8,&local_98);
          pnVar23 = (local_308->
                    super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).rowWeight.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = (uint *)((long)&(pnVar23->m_backend).data + local_178);
          *(undefined8 *)puVar2 = local_2f8.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = local_2f8.data._M_elems._8_8_;
          puVar2 = (uint *)((long)&(pnVar23->m_backend).data + local_178 + 0x10);
          *(undefined8 *)puVar2 = local_2f8.data._M_elems._16_8_;
          *(undefined8 *)(puVar2 + 2) = local_2f8.data._M_elems._24_8_;
          *(undefined8 *)((long)&(pnVar23->m_backend).data + local_178 + 0x20) =
               local_2f8.data._M_elems._32_8_;
          *(int *)((long)&(pnVar23->m_backend).data + local_178 + 0x28) = local_2f8.exp;
          *(bool *)((long)&(pnVar23->m_backend).data + local_178 + 0x2c) = local_2f8.neg;
          *(undefined8 *)((long)&(pnVar23->m_backend).data + local_178 + 0x30) = local_2f8._48_8_;
        }
        (local_308->
        super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).rowRight.data[local_310] = bVar21;
      } while (local_310 != 0);
    }
  }
  return;
}

Assistant:

void SPxVectorST<R>::setupWeights(SPxSolverBase<R>& base)
{
   if(state == PVEC)
   {
      if(vec.dim() != base.nCols())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      const VectorBase<R>& obj = base.maxObj();
      R eps = base.epsilon();
      R bias = 10000 * eps;
      R x, y;
      int i;

      SPxOut::debug(this, "DVECST01 colWeight[]: ");

      for(i = base.nCols(); i--;)
      {
         x = vec[i] - base.SPxLPBase<R>::lower(i);
         y = base.SPxLPBase<R>::upper(i) - vec[i];

         if(x < y)
         {
            this->colWeight[i] = -x - bias * obj[i];
            this->colUp[i] = 0;
         }
         else
         {
            this->colWeight[i] = -y + bias * obj[i];
            this->colUp[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->colWeight[i]);
      }

      SPxOut::debug(this, "\n \n");

      SPxOut::debug(this, "DVECST02 rowWeight[]: ");

      for(i = base.nRows(); i--;)
      {
         const SVectorBase<R>& row = base.rowVector(i);
         y = vec * row;
         x = (y - base.lhs(i));
         y = (base.rhs(i) - y);

         if(x < y)
         {
            this->rowWeight[i] = -x - eps * row.size() - bias * (obj * row);
            this->rowRight[i] = 0;
         }
         else
         {
            this->rowWeight[i] = -y - eps * row.size() + bias * (obj * row);
            this->rowRight[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->rowWeight[i]);
      }

      SPxOut::debug(this, "\n");
   }

   else if(state == DVEC)
   {
      if(vec.dim() != base.nRows())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      R x, y, len;
      int i, j;

      for(i = base.nRows(); i--;)
         this->rowWeight[i] += spxAbs(vec[i]);

      for(i = base.nCols(); i--;)
      {
         const SVectorBase<R>& col = base.colVector(i);

         for(y = len = 0, j = col.size(); j--;)
         {
            x = col.value(j);
            y += vec[col.index(j)] * x;
            len += x * x;
         }

         if(len > 0)
            this->colWeight[i] += spxAbs(y / len - base.maxObj(i));
      }
   }
   else
      SPxWeightST<R>::setupWeights(base);
}